

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asmcode.cpp
# Opt level: O0

opcode * assembler::anon_unknown_0::make_opcode
                   (opcode *__return_storage_ptr__,string *mnemonic,uint64_t flags,uint8_t opcode_id
                   ,uint8_t opcode_id_2,opcode_operand_type op1)

{
  opcode_operand_type op1_local;
  uint8_t opcode_id_2_local;
  uint8_t opcode_id_local;
  uint64_t flags_local;
  string *mnemonic_local;
  opcode *o;
  
  opcode::opcode(__return_storage_ptr__);
  __return_storage_ptr__->prefix = '\0';
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mnemonic,(string *)mnemonic);
  __return_storage_ptr__->flags = flags;
  __return_storage_ptr__->opcode_id = opcode_id;
  __return_storage_ptr__->opcode_id_2 = opcode_id_2;
  __return_storage_ptr__->operand_1 = op1;
  __return_storage_ptr__->operand_2 = none;
  __return_storage_ptr__->operand_3 = none;
  __return_storage_ptr__->use_postfix = false;
  return __return_storage_ptr__;
}

Assistant:

opcode make_opcode(std::string mnemonic, uint64_t flags, uint8_t opcode_id, uint8_t opcode_id_2, opcode::opcode_operand_type op1)
    {
    opcode o;
    o.prefix = 0;
    o.mnemonic = mnemonic;
    o.flags = flags;
    o.opcode_id = opcode_id;
    o.opcode_id_2 = opcode_id_2;
    o.operand_1 = op1;
    o.operand_2 = opcode::none;
    o.operand_3 = opcode::none;
    o.use_postfix = false;
    return o;
    }